

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::GenerateXMLHeader(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                    (this->super_cmCTestGenericHandler).AppendXML);
  std::__cxx11::string::string((string *)&local_50,"Build",(allocator *)&local_30);
  cmXMLWriter::StartElement(xml,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"StartDateTime",(allocator *)&local_30);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_50,&this->StartBuild);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"StartBuildTime",&local_51);
  local_30._M_dataplus._M_p._0_4_ = (undefined4)(long)this->StartBuildTime;
  cmXMLWriter::Element<unsigned_int>(xml,&local_50,(uint *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"BuildCommand",&local_51);
  GetMakeCommand_abi_cxx11_(&local_30,this);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLHeader(cmXMLWriter& xml)
{
  this->CTest->StartXML(xml, this->AppendXML);
  xml.StartElement("Build");
  xml.Element("StartDateTime", this->StartBuild);
  xml.Element("StartBuildTime",
    static_cast<unsigned int>(this->StartBuildTime));
  xml.Element("BuildCommand", this->GetMakeCommand());
}